

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::replaceLaneI8x16
          (Literal *__return_storage_ptr__,Literal *this,Literal *other,uint8_t index)

{
  uint8_t index_local;
  Literal *other_local;
  Literal *this_local;
  
  replace<16,_&wasm::Literal::getLanesUI8x16>(__return_storage_ptr__,this,other,index);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::replaceLaneI8x16(const Literal& other, uint8_t index) const {
  return replace<16, &Literal::getLanesUI8x16>(*this, other, index);
}